

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::Char1(AsciiParser *this,char *c)

{
  bool bVar1;
  char *c_local;
  AsciiParser *this_local;
  
  bVar1 = StreamReader::read1(this->_sr,c);
  return bVar1;
}

Assistant:

bool AsciiParser::Char1(char *c) { return _sr->read1(c); }